

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O1

typed_option<bool> * __thiscall
VW::config::typed_option<bool>::value(typed_option<bool> *this,bool value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool *__tmp;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002cd8d8;
  *(bool *)&p_Var1[1]._vptr__Sp_counted_base = value;
  (this->m_value).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  this_00 = (this->m_value).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_value).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return this;
}

Assistant:

typed_option& value(T value)
  {
    m_value = std::make_shared<T>(value);
    return *this;
  }